

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

TRexBool trex_searchrange(TRex *exp,char *text_begin,char *text_end,char **out_begin,char **out_end)

{
  int iVar1;
  char *pcVar2;
  TRexBool TVar3;
  char *str;
  char *pcVar4;
  
  if (text_end <= text_begin) {
    return 0;
  }
  iVar1 = exp->_first;
  exp->_bol = text_begin;
  exp->_eol = text_end;
  pcVar2 = text_begin;
joined_r0x00106ba9:
  do {
    pcVar4 = pcVar2;
    str = text_begin;
    if (iVar1 != -1) {
      exp->_currsubexp = 0;
      text_begin = trex_matchnode(exp,exp->_nodes + iVar1,str,(TRexNode *)0x0);
      str = (char *)0x0;
      if (text_begin != (char *)0x0) {
        iVar1 = exp->_nodes[iVar1].next;
        pcVar2 = pcVar4;
        goto joined_r0x00106ba9;
      }
    }
    if ((str != (char *)0x0) ||
       (text_begin = pcVar4 + 1, pcVar2 = text_begin, text_begin == text_end)) {
      if (str == (char *)0x0) {
        TVar3 = 0;
      }
      else {
        if (out_begin != (char **)0x0) {
          *out_begin = pcVar4;
        }
        TVar3 = 1;
        if (out_end != (char **)0x0) {
          *out_end = str;
        }
      }
      return TVar3;
    }
  } while( true );
}

Assistant:

TRexBool trex_searchrange(TRex * exp, const TRexChar * text_begin, const TRexChar * text_end, const TRexChar ** out_begin, const TRexChar ** out_end) {
	const TRexChar * cur = NULL;
	int node = exp->_first;

	if (text_begin >= text_end) {
		return TRex_False;
	}

	exp->_bol = text_begin;
	exp->_eol = text_end;

	do {
		cur = text_begin;

		while (node != -1) {
			exp->_currsubexp = 0;
			cur = trex_matchnode(exp, &exp->_nodes[node], cur, NULL);

			if (!cur) {
				break;
			}

			node = exp->_nodes[node].next;
		}

		text_begin++;
	} while (cur == NULL && text_begin != text_end);

	if (cur == NULL) {
		return TRex_False;
	}

	--text_begin;

	if (out_begin) {
		*out_begin = text_begin;
	}

	if (out_end) {
		*out_end = cur;
	}

	return TRex_True;
}